

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwSetWindowSize(GLFWwindow *handle,int width,int height)

{
  byte *pbVar1;
  undefined8 uVar2;
  _GLFWwindow *window;
  GLFWvidmode GStack_38;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (*(long *)(handle + 0x30) != 0) {
    *(int *)(handle + 0x18) = width;
    *(int *)(handle + 0x1c) = height;
    _glfwPlatformSetWindowSize((_GLFWwindow *)handle,width,height);
    return;
  }
  if (*(_GLFWmonitor **)(handle + 0x30) == (_GLFWmonitor *)0x0) {
    if (handle[8] == (GLFWwindow)0x0) {
      pbVar1 = (byte *)XAllocSizeHints();
      *pbVar1 = *pbVar1 | 0x30;
      *(int *)(pbVar1 + 0x20) = width;
      *(int *)(pbVar1 + 0x18) = width;
      *(int *)(pbVar1 + 0x24) = height;
      *(int *)(pbVar1 + 0x1c) = height;
      XSetWMNormalHints(_glfw.x11.display,*(undefined8 *)(handle + 0x270),pbVar1);
      XFree(pbVar1);
    }
    uVar2 = *(undefined8 *)(handle + 0x270);
    GStack_38.width = width;
    GStack_38.height = height;
  }
  else {
    _glfwSetVideoMode(*(_GLFWmonitor **)(handle + 0x30),(GLFWvidmode *)(handle + 0x18));
    if (handle[0x280] == (GLFWwindow)0x0) goto LAB_001bc933;
    _glfwPlatformGetVideoMode(*(_GLFWmonitor **)(handle + 0x30),&GStack_38);
    uVar2 = *(undefined8 *)(handle + 0x270);
  }
  XResizeWindow(_glfw.x11.display,uVar2,GStack_38.width,GStack_38.height);
LAB_001bc933:
  XFlush(_glfw.x11.display);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowSize(GLFWwindow* handle, int width, int height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
    {
        window->videoMode.width  = width;
        window->videoMode.height = height;
    }

    _glfwPlatformSetWindowSize(window, width, height);
}